

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv__tcp_keepalive(int fd,int on,uint delay)

{
  int iVar1;
  int *piVar2;
  uint local_18;
  int local_14;
  uint delay_local;
  int on_local;
  int fd_local;
  
  local_18 = delay;
  local_14 = on;
  delay_local = fd;
  iVar1 = setsockopt(fd,1,9,&local_14,4);
  if (iVar1 == 0) {
    if ((local_14 != 0) && (iVar1 = setsockopt(delay_local,6,4,&local_18,4), iVar1 != 0)) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    on_local = 0;
  }
  else {
    piVar2 = __errno_location();
    on_local = -*piVar2;
  }
  return on_local;
}

Assistant:

int uv__tcp_keepalive(int fd, int on, unsigned int delay) {
  if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, &on, sizeof(on)))
    return UV__ERR(errno);

#ifdef TCP_KEEPIDLE
  if (on && setsockopt(fd, IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)))
    return UV__ERR(errno);
#endif

  /* Solaris/SmartOS, if you don't support keep-alive,
   * then don't advertise it in your system headers...
   */
  /* FIXME(bnoordhuis) That's possibly because sizeof(delay) should be 1. */
#if defined(TCP_KEEPALIVE) && !defined(__sun)
  if (on && setsockopt(fd, IPPROTO_TCP, TCP_KEEPALIVE, &delay, sizeof(delay)))
    return UV__ERR(errno);
#endif

  return 0;
}